

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cpp
# Opt level: O0

void __thiscall
PythonGenerator::stdVectorToString
          (PythonGenerator *this,vector<double,_std::allocator<double>_> *toConvert,string *result)

{
  size_type sVar1;
  reference pvVar2;
  undefined1 local_98 [8];
  string num2str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string num2str_1;
  int i;
  int toConvertSize;
  string *result_local;
  vector<double,_std::allocator<double>_> *toConvert_local;
  PythonGenerator *this_local;
  
  sVar1 = std::vector<double,_std::allocator<double>_>::size(toConvert);
  num2str_1.field_2._12_4_ = (undefined4)sVar1;
  for (num2str_1.field_2._8_4_ = 0; (int)num2str_1.field_2._8_4_ < num2str_1.field_2._12_4_ + -1;
      num2str_1.field_2._8_4_ = num2str_1.field_2._8_4_ + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::at
                       (toConvert,(long)(int)num2str_1.field_2._8_4_);
    doubleToString_abi_cxx11_((string *)local_48,*pvVar2);
    std::operator+(&local_68,(string *)local_48,",");
    std::__cxx11::string::operator+=((string *)result,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)local_48);
  }
  pvVar2 = std::vector<double,_std::allocator<double>_>::at
                     (toConvert,(long)(num2str_1.field_2._12_4_ + -1));
  doubleToString_abi_cxx11_((string *)local_98,*pvVar2);
  std::__cxx11::string::operator+=((string *)result,(string *)local_98);
  std::__cxx11::string::~string((string *)local_98);
  return;
}

Assistant:

void PythonGenerator::stdVectorToString(std::vector<double> toConvert, std::string& result)
{
    int toConvertSize = toConvert.size();
    for(int i = 0; i < toConvertSize - 1; i++)
    {
        std::string num2str = doubleToString(toConvert.at(i));
        result += num2str + ",";
    }
    std::string num2str = doubleToString(toConvert.at(toConvertSize - 1));
    result += num2str;
}